

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O0

LispPTR compare_chars(char *char1,char *char2,DLword length)

{
  int iVar1;
  DLword length_local;
  char *char2_local;
  char *char1_local;
  
  iVar1 = bytecmp(char1,char2,(uint)length);
  char1_local._4_4_ = (uint)(iVar1 != 0);
  return char1_local._4_4_;
}

Assistant:

LispPTR compare_chars(const char *char1, const char *char2, DLword length) {
#ifndef BYTESWAP
  if (memcmp(char1, char2, length) == 0)
#else
  if (bytecmp(char1, char2, length))
#endif /* BYTESWAP */

  {
    return (T);
  } else {
    return (NIL);
  }

}